

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O1

void appendAsUtf8(uint32_t code,string *outUtf8String)

{
  byte bVar1;
  char __c;
  
  if (0x7f < code) {
    if (code < 0x800) {
      bVar1 = (byte)(code >> 6) | 0xc0;
    }
    else {
      if (code < 0x10000) {
        bVar1 = (byte)(code >> 0xc) | 0xe0;
      }
      else {
        __c = '?';
        if (0x10ffff < code) goto LAB_0011bbf4;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (outUtf8String,(byte)(code >> 0x12) | 0xf0);
        bVar1 = (byte)(code >> 0xc) & 0x3f | 0x80;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (outUtf8String,bVar1);
      bVar1 = (byte)(code >> 6) & 0x3f | 0x80;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,bVar1);
    code = (uint32_t)((byte)code & 0x3f | 0x80);
  }
  __c = (char)code;
LAB_0011bbf4:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (outUtf8String,__c);
  return;
}

Assistant:

static void appendAsUtf8(uint32_t code, std::string &outUtf8String) {
  if (code < 0x80) {
    outUtf8String.push_back(static_cast<char>(code & 0x7F));
  } else if (code < 0x800) {
    outUtf8String.push_back(static_cast<char>(0xC0 + ((code >> 6) & 0x1F)));
    outUtf8String.push_back(static_cast<char>(0x80 + (code & 0x3F)));
  } else if (code < 0x10000) {
    outUtf8String.push_back(static_cast<char>(0xE0 + ((code >> 12) & 0x0F)));
    outUtf8String.push_back(static_cast<char>(0x80 + ((code >> 6) & 0x3F)));
    outUtf8String.push_back(static_cast<char>(0x80 + (code & 0x3F)));
  } else if (code < 0x110000) {
    outUtf8String.push_back(static_cast<char>(0xF0 + ((code >> 18) & 0x07)));
    outUtf8String.push_back(static_cast<char>(0x80 + ((code >> 12) & 0x3F)));
    outUtf8String.push_back(static_cast<char>(0x80 + ((code >> 6) & 0x3F)));
    outUtf8String.push_back(static_cast<char>(0x80 + (code & 0x3F)));
  } else {
    outUtf8String.push_back('?');
  }
}